

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlatformUtility.cpp
# Opt level: O2

Handle llbuild::basic::sys::OpenLibrary(char *path)

{
  Handle pvVar1;
  
  pvVar1 = (Handle)dlopen(path,1);
  return pvVar1;
}

Assistant:

sys::ModuleTraits<>::Handle sys::OpenLibrary(const char *path) {
#if defined(_WIN32)
  int cchLength =
      MultiByteToWideChar(CP_UTF8, MB_ERR_INVALID_CHARS, path, strlen(path),
                          nullptr, 0);
  std::u16string buffer(cchLength + 1, 0);
  MultiByteToWideChar(CP_UTF8, MB_ERR_INVALID_CHARS, path, strlen(path),
                      const_cast<LPWSTR>(reinterpret_cast<LPCWSTR>(buffer.data())),
                      buffer.size());

  return LoadLibraryW(reinterpret_cast<LPCWSTR>(buffer.data()));
#else
  return dlopen(path, RTLD_LAZY);
#endif
}